

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O0

void __thiscall mp::NameProvider::NameProvider(NameProvider *this,CStringRef gen_name,CStringRef n2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> *alloc;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [21];
  BasicCStringRef<char> local_10;
  BasicCStringRef<char> local_8;
  
  this_01 = in_RDI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x27acc0);
  fmt::BasicCStringRef<char>::c_str(&local_8);
  __a = local_25;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,__a);
  std::allocator<char>::~allocator(local_25);
  this_00 = (BasicMemoryWriter<char,_std::allocator<char>_> *)((long)&in_RDI[1].field_2 + 8);
  fmt::BasicCStringRef<char>::c_str(&local_10);
  alloc = &local_26;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,__a);
  std::allocator<char>::~allocator(&local_26);
  internal::NameReader::NameReader((NameReader *)0x27ad72);
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter(this_00,alloc);
  std::allocator<char>::~allocator(&local_27);
  return;
}

Assistant:

mp::NameProvider::NameProvider(
    fmt::CStringRef gen_name, fmt::CStringRef n2)
  : gen_name_(gen_name.c_str()), gen_name_2_(n2.c_str()) { }